

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::pushFunctionScope
          (CheckerVisitor *this,VarScope *functionScope,FunctionDecl *decl)

{
  FunctionDecl *pFVar1;
  mapped_type pFVar2;
  FunctionDecl *pFVar3;
  mapped_type *ppFVar4;
  Chunk *pCVar5;
  FunctionDecl *local_38;
  
  local_38 = decl;
  ppFVar4 = std::__detail::
            _Map_base<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->functionInfoMap,&local_38);
  pFVar3 = local_38;
  if (*ppFVar4 == (mapped_type)0x0) {
    pFVar1 = this->currentScope->owner;
    pCVar5 = Arena::findChunk(this->arena,0x40);
    pFVar2 = (mapped_type)pCVar5->_ptr;
    pCVar5->_ptr = (uint8_t *)(pFVar2 + 1);
    pFVar2->owner = pFVar1;
    (pFVar2->modifiable).
    super__Vector_base<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar2->modifiable).
    super__Vector_base<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pFVar2->modifiable).
    super__Vector_base<SQCompilation::FunctionInfo::Modifiable,_std::allocator<SQCompilation::FunctionInfo::Modifiable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar2->declaration = pFVar3;
    (pFVar2->parameters).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar2->parameters).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pFVar2->parameters).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppFVar4 = std::__detail::
              _Map_base<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->functionInfoMap,&local_38);
    *ppFVar4 = pFVar2;
  }
  this->currentScope = functionScope;
  return;
}

Assistant:

void CheckerVisitor::pushFunctionScope(VarScope *functionScope, const FunctionDecl *decl) {

  FunctionInfo *info = functionInfoMap[decl];

  if (!info) {
    info = makeFunctionInfo(decl, currentScope->owner);
    functionInfoMap[decl] = info;
  }

  currentScope = functionScope;
}